

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O2

void Gia_ManSpeedupObj(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vLeaves,
                      Vec_Int_t *vTimes)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iLit1;
  Gia_Obj_t *pGVar6;
  Vec_Int_t *vNodes;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int pCofs [32];
  
  Gia_ManIncrementTravId(p);
  Gia_ObjSetTravIdCurrent(p,p->pObjs);
  pGVar6 = (Gia_Obj_t *)0x0;
  for (iVar10 = 0; iVar10 < vLeaves->nSize; iVar10 = iVar10 + 1) {
    iVar3 = Vec_IntEntry(vLeaves,iVar10);
    pGVar6 = Gia_ManObj(p,iVar3);
    if (pGVar6 == (Gia_Obj_t *)0x0) {
      pGVar6 = (Gia_Obj_t *)0x0;
      break;
    }
    Gia_ObjSetTravIdCurrent(p,pGVar6);
  }
  vNodes = Vec_IntAlloc(100);
  iVar10 = Gia_ManSpeedupObj_rec(p,pObj,vNodes);
  if (iVar10 == 0) {
    puts("Bad node!!!");
    Vec_IntFree(vNodes);
    return;
  }
  bVar2 = (byte)vTimes->nSize & 0x1f;
  uVar4 = 1 << bVar2;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < 1 << bVar2) {
    uVar8 = (ulong)uVar4;
  }
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    for (iVar10 = 0; iVar10 < vLeaves->nSize; iVar10 = iVar10 + 1) {
      iVar3 = Vec_IntEntry(vLeaves,iVar10);
      pGVar6 = Gia_ManObj(p,iVar3);
      if (pGVar6 == (Gia_Obj_t *)0x0) {
        pGVar6 = (Gia_Obj_t *)0x0;
        break;
      }
      iVar3 = Gia_ObjId(p,pGVar6);
      uVar5 = Abc_Var2Lit(iVar3,0);
      pGVar6->Value = uVar5;
    }
    for (uVar5 = 0; (int)uVar5 < vTimes->nSize; uVar5 = uVar5 + 1) {
      iVar10 = Vec_IntEntry(vTimes,uVar5);
      pGVar6 = Gia_ManObj(p,iVar10);
      if (pGVar6 == (Gia_Obj_t *)0x0) {
        pGVar6 = (Gia_Obj_t *)0x0;
        break;
      }
      pGVar6->Value = (uint)(((uint)uVar7 >> (uVar5 & 0x1f) & 1) != 0);
    }
    for (iVar10 = 0; iVar10 < vNodes->nSize; iVar10 = iVar10 + 1) {
      iVar3 = Vec_IntEntry(vNodes,iVar10);
      pGVar6 = Gia_ManObj(p,iVar3);
      iVar3 = Abc_LitNotCond(pGVar6[-(*(ulong *)pGVar6 & 0x1fffffff)].Value,
                             (uint)(*(ulong *)pGVar6 >> 0x1d) & 1);
      iLit1 = Abc_LitNotCond(pGVar6[-(*(ulong *)pGVar6 >> 0x20 & 0x1fffffff)].Value,
                             (uint)(*(ulong *)pGVar6 >> 0x3d) & 1);
      uVar5 = Gia_ManHashAnd(pNew,iVar3,iLit1);
      pGVar6->Value = uVar5;
    }
    pCofs[uVar7] = pGVar6->Value;
  }
  Vec_IntFree(vNodes);
  for (iVar10 = 0; iVar10 < vTimes->nSize; iVar10 = iVar10 + 1) {
    iVar3 = Vec_IntEntry(vTimes,iVar10);
    pGVar6 = Gia_ManObj(p,iVar3);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    for (lVar9 = 0; lVar9 < (int)uVar4; lVar9 = lVar9 + (2 << ((byte)iVar10 & 0x1f))) {
      iVar3 = Gia_ObjId(p,(Gia_Obj_t *)((ulong)pGVar6 & 0xfffffffffffffffe));
      iVar3 = Abc_Var2Lit(iVar3,(uint)pGVar6 & 1);
      iVar3 = Gia_ManHashMux(pNew,iVar3,pCofs[(1 << ((byte)iVar10 & 0x1f)) + lVar9],pCofs[lVar9]);
      pCofs[lVar9] = iVar3;
    }
  }
  iVar10 = Gia_ObjId(p,pObj);
  if (pCofs[0] < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10c,"int Abc_Lit2Var(int)");
  }
  uVar4 = (uint)pCofs[0] >> 1;
  if (iVar10 < (int)uVar4) {
    Gia_ObjSetRepr(pNew,uVar4,iVar10);
    piVar1 = pNew->pNexts;
    piVar1[uVar4] = piVar1[iVar10];
    piVar1[iVar10] = uVar4;
  }
  return;
}

Assistant:

void Gia_ManSpeedupObj( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vLeaves, Vec_Int_t * vTimes )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pTemp = NULL;
    int pCofs[32], nCofs, nSkip, i, k, iResult, iObj;
    // mark the leaves
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachObjVec( vLeaves, p, pTemp, i )
        Gia_ObjSetTravIdCurrent( p, pTemp );
    // collect the AIG nodes
    vNodes = Vec_IntAlloc( 100 );
    if ( !Gia_ManSpeedupObj_rec( p, pObj, vNodes ) )
    {
        printf( "Bad node!!!\n" );
        Vec_IntFree( vNodes );
        return;
    }
    // derive cofactors
    nCofs = (1 << Vec_IntSize(vTimes));
    for ( i = 0; i < nCofs; i++ )
    {
        Gia_ManForEachObjVec( vLeaves, p, pTemp, k )
            pTemp->Value = Abc_Var2Lit( Gia_ObjId(p, pTemp), 0 );
        Gia_ManForEachObjVec( vTimes, p, pTemp, k )
            pTemp->Value = ((i & (1<<k)) != 0);
        Gia_ManForEachObjVec( vNodes, p, pTemp, k )
            pTemp->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pTemp), Gia_ObjFanin1Copy(pTemp) );
        pCofs[i] = pTemp->Value;
    }
    Vec_IntFree( vNodes );
    // collect the resulting tree
    Gia_ManForEachObjVec( vTimes, p, pTemp, k )
        for ( nSkip = (1<<k), i = 0; i < nCofs; i += 2*nSkip )
            pCofs[i] = Gia_ManHashMux( pNew, Gia_ObjToLit(p,pTemp), pCofs[i+nSkip], pCofs[i] );
    // create choice node  (pObj is repr and ppCofs[0] is new)
    iObj    = Gia_ObjId( p, pObj );
    iResult = Abc_Lit2Var( pCofs[0] );
    if ( iResult <= iObj )
        return;
    Gia_ObjSetRepr( pNew, iResult, iObj );
    Gia_ObjSetNext( pNew, iResult, Gia_ObjNext(pNew, iObj) );
    Gia_ObjSetNext( pNew, iObj, iResult );
}